

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * columnTypeImpl(NameContext *pNC,Expr *pExpr)

{
  int iVar1;
  bool bVar2;
  Expr *p_1;
  Select *pS_1;
  NameContext sNC_1;
  Expr *p;
  NameContext sNC;
  SrcList *pTabList;
  long *plStack_38;
  int iCol;
  Select *pS;
  Table *pTab;
  char *pcStack_20;
  int j;
  char *zType;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  pcStack_20 = (char *)0x0;
  if (pExpr->op == '\x7f') {
    sNC_1.pParse = (Parse *)((pExpr->x).pSelect)->pSrc;
    pS_1 = (Select *)pNC->pParse;
    sNC_1.uNC = (anon_union_8_3_1bb8468b_for_uNC)pNC;
    pcStack_20 = columnTypeImpl((NameContext *)&pS_1,((pExpr->x).pSelect)->pEList->a[0].pExpr);
  }
  else if (pExpr->op == 0x9e) {
    pS = (Select *)0x0;
    plStack_38 = (long *)0x0;
    iVar1 = (int)pExpr->iColumn;
    pExpr_local = (Expr *)pNC;
    while (pExpr_local != (Expr *)0x0 && pS == (Select *)0x0) {
      sNC.pWinSelect = (Select *)(pExpr_local->u).zToken;
      pTab._4_4_ = 0;
      while( true ) {
        bVar2 = false;
        if (pTab._4_4_ < *(int *)&(sNC.pWinSelect)->pEList) {
          bVar2 = (sNC.pWinSelect)->addrOpenEphm[(long)pTab._4_4_ * 0x1c + 0xb] != pExpr->iTable;
        }
        if (!bVar2) break;
        pTab._4_4_ = pTab._4_4_ + 1;
      }
      if (pTab._4_4_ < *(int *)&(sNC.pWinSelect)->pEList) {
        pS = *(Select **)((sNC.pWinSelect)->addrOpenEphm + (long)pTab._4_4_ * 0x1c + 3);
        plStack_38 = *(long **)((sNC.pWinSelect)->addrOpenEphm + (long)pTab._4_4_ * 0x1c + 5);
      }
      else {
        pExpr_local = pExpr_local->pRight;
      }
    }
    if (pS != (Select *)0x0) {
      if (plStack_38 == (long *)0x0) {
        if (iVar1 < 0) {
          pcStack_20 = "INTEGER";
        }
        else {
          pcStack_20 = sqlite3ColumnType((Column *)(*(long *)&pS->op + (long)iVar1 * 0x20),
                                         (char *)0x0);
        }
      }
      else if ((-1 < iVar1) && (iVar1 < *(int *)*plStack_38)) {
        sNC_1.pWinSelect = *(Select **)(*plStack_38 + 8 + (long)iVar1 * 0x20);
        sNC.pParse = (Parse *)plStack_38[5];
        sNC.uNC.pEList = (ExprList *)pExpr_local;
        p = *(Expr **)pExpr_local;
        pcStack_20 = columnTypeImpl((NameContext *)&p,(Expr *)sNC_1.pWinSelect);
      }
    }
  }
  return pcStack_20;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  assert( pExpr->op!=TK_AGG_COLUMN );  /* This routine runes before aggregates
                                       ** are processed */
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol); 
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}